

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O3

int VP8Decode(VP8Decoder *dec,VP8Io *io)

{
  VP8MB *pVVar1;
  int iVar2;
  VP8StatusCode VVar3;
  uint uVar4;
  WebPWorkerInterface *pWVar5;
  char *pcVar6;
  uint uVar7;
  
  if (dec == (VP8Decoder *)0x0) {
    return 0;
  }
  if (io == (VP8Io *)0x0) {
    if (dec->status_ != VP8_STATUS_OK) {
      return 0;
    }
    dec->status_ = VP8_STATUS_INVALID_PARAM;
    dec->ready_ = 0;
    dec->error_msg_ = "NULL VP8Io parameter in VP8Decode().";
    return 0;
  }
  if ((dec->ready_ == 0) && (iVar2 = VP8GetHeaders(dec,io), iVar2 == 0)) {
    return 0;
  }
  VVar3 = VP8EnterCritical(dec,io);
  if (VVar3 != VP8_STATUS_OK) goto LAB_0010bb88;
  iVar2 = VP8InitFrame(dec,io);
  uVar7 = 0;
  if (iVar2 != 0) {
    dec->mb_y_ = 0;
    if (0 < dec->br_mb_y_) {
      uVar7 = 0;
      do {
        uVar4 = dec->num_parts_minus_one_;
        iVar2 = VP8ParseIntraModeRow(&dec->br_,dec);
        if (iVar2 == 0) {
          uVar7 = 0;
          if (dec->status_ == VP8_STATUS_OK) {
            dec->status_ = VP8_STATUS_NOT_ENOUGH_DATA;
            dec->ready_ = 0;
            pcVar6 = "Premature end-of-partition0 encountered.";
LAB_0010bce1:
            uVar7 = 0;
            dec->error_msg_ = pcVar6;
          }
          goto LAB_0010bce5;
        }
        if (dec->mb_x_ < dec->mb_w_) {
          do {
            iVar2 = VP8DecodeMB(dec,dec->parts_ + (uVar7 & uVar4));
            if (iVar2 == 0) {
              uVar7 = 0;
              if (dec->status_ != VP8_STATUS_OK) goto LAB_0010bce5;
              dec->status_ = VP8_STATUS_NOT_ENOUGH_DATA;
              dec->ready_ = 0;
              pcVar6 = "Premature end-of-file encountered.";
              goto LAB_0010bce1;
            }
            iVar2 = dec->mb_x_ + 1;
            dec->mb_x_ = iVar2;
          } while (iVar2 < dec->mb_w_);
        }
        pVVar1 = dec->mb_info_;
        pVVar1[-1].nz_ = '\0';
        pVVar1[-1].nz_dc_ = '\0';
        dec->intra_l_[0] = '\0';
        dec->intra_l_[1] = '\0';
        dec->intra_l_[2] = '\0';
        dec->intra_l_[3] = '\0';
        dec->mb_x_ = 0;
        iVar2 = VP8ProcessRow(dec,io);
        if (iVar2 == 0) {
          uVar7 = 0;
          if (dec->status_ == VP8_STATUS_OK) {
            dec->status_ = VP8_STATUS_USER_ABORT;
            dec->ready_ = 0;
            pcVar6 = "Output aborted.";
            goto LAB_0010bce1;
          }
          goto LAB_0010bce5;
        }
        uVar7 = dec->mb_y_ + 1;
        dec->mb_y_ = uVar7;
      } while ((int)uVar7 < dec->br_mb_y_);
    }
    if (0 < dec->mt_method_) {
      pWVar5 = WebPGetWorkerInterface();
      iVar2 = (*pWVar5->Sync)(&dec->worker_);
      uVar7 = 0;
      if (iVar2 == 0) goto LAB_0010bce5;
    }
    uVar7 = 1;
  }
LAB_0010bce5:
  uVar4 = VP8ExitCritical(dec,io);
  if ((uVar4 & uVar7) != 0) {
    dec->ready_ = 0;
    return 1;
  }
LAB_0010bb88:
  VP8Clear(dec);
  return 0;
}

Assistant:

int VP8Decode(VP8Decoder* const dec, VP8Io* const io) {
  int ok = 0;
  if (dec == NULL) {
    return 0;
  }
  if (io == NULL) {
    return VP8SetError(dec, VP8_STATUS_INVALID_PARAM,
                       "NULL VP8Io parameter in VP8Decode().");
  }

  if (!dec->ready_) {
    if (!VP8GetHeaders(dec, io)) {
      return 0;
    }
  }
  assert(dec->ready_);

  // Finish setting up the decoding parameter. Will call io->setup().
  ok = (VP8EnterCritical(dec, io) == VP8_STATUS_OK);
  if (ok) {   // good to go.
    // Will allocate memory and prepare everything.
    if (ok) ok = VP8InitFrame(dec, io);

    // Main decoding loop
    if (ok) ok = ParseFrame(dec, io);

    // Exit.
    ok &= VP8ExitCritical(dec, io);
  }

  if (!ok) {
    VP8Clear(dec);
    return 0;
  }

  dec->ready_ = 0;
  return ok;
}